

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::~IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  long *plVar3;
  void *pvVar4;
  
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x85d750;
  *(undefined8 *)&this->field_0xd8 = 0x85d840;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x85d778;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = 0x85d7a0;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x80 = 0x85d7c8;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.field_0x90 = 0x85d7f0;
  *(undefined8 *)&(this->super_IfcTerminatorSymbol).field_0xa8 = 0x85d818;
  puVar2 = *(undefined1 **)&(this->super_IfcTerminatorSymbol).field_0xb8;
  if (puVar2 != &this->field_0xc8) {
    operator_delete(puVar2,*(long *)&this->field_0xc8 + 1);
  }
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x85dbf8;
  *(undefined8 *)&this->field_0xd8 = 0x85dc48;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x85dc20;
  plVar3 = (long *)(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
                   super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr._M_dataplus._M_p;
  paVar1 = &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
            super_IfcAnnotationOccurrence.super_IfcStyledItem.Name.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar3 != paVar1) {
    operator_delete(plVar3,paVar1->_M_allocated_capacity + 1);
  }
  pvVar4 = *(void **)&(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
                      super_IfcAnnotationOccurrence.super_IfcStyledItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x20;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,*(long *)&(this->super_IfcTerminatorSymbol).
                                     super_IfcAnnotationSymbolOccurrence.
                                     super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x40 -
                           (long)pvVar4);
  }
  operator_delete(this,0xf0);
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}